

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O0

exr_result_t exr_attr_float_vector_init(exr_context_t ctxt,exr_attr_float_vector_t *fv,int32_t nent)

{
  exr_result_t eVar1;
  ulong uVar2;
  undefined8 uVar3;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  size_t bytes;
  exr_attr_float_vector_t nil;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  int *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  uVar2 = (long)local_1c << 2;
  if (local_10 == 0) {
    local_4 = 2;
  }
  else if (local_18 == (int *)0x0) {
    local_4 = (**(code **)(local_10 + 0x40))
                        (local_10,3,"Invalid reference to float vector object to initialize");
  }
  else {
    *(undefined8 *)local_18 = local_30;
    *(undefined8 *)(local_18 + 2) = local_28;
    if (local_1c < 0) {
      local_4 = (**(code **)(local_10 + 0x48))
                          (local_10,3,
                           "Received request to allocate negative sized float vector (%d entries)",
                           local_1c);
    }
    else if (uVar2 < 0x80000000) {
      if (uVar2 != 0) {
        uVar3 = (**(code **)(local_10 + 0x58))(uVar2);
        *(undefined8 *)(local_18 + 2) = uVar3;
        if (*(long *)(local_18 + 2) == 0) {
          eVar1 = (**(code **)(local_10 + 0x38))(local_10,1);
          return eVar1;
        }
        *local_18 = local_1c;
        local_18[1] = local_1c;
      }
      local_4 = 0;
    }
    else {
      local_4 = (**(code **)(local_10 + 0x48))
                          (local_10,3,"Invalid too large size for float vector (%d entries)",
                           local_1c);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_float_vector_init (
    exr_context_t ctxt, exr_attr_float_vector_t* fv, int32_t nent)
{
    exr_attr_float_vector_t nil   = {0};
    size_t                  bytes = (size_t) (nent) * sizeof (float);

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!fv)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float vector object to initialize");

    *fv = nil;

    if (nent < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized float vector (%d entries)",
            nent);

    if (bytes > (size_t) INT32_MAX)
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid too large size for float vector (%d entries)",
            nent);
    }
    else if (bytes > 0)
    {
        fv->arr = (float*) ctxt->alloc_fn (bytes);
        if (fv->arr == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        fv->length     = nent;
        fv->alloc_size = nent;
    }

    return EXR_ERR_SUCCESS;
}